

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_convert_tile_tsbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  void *__src;
  long lVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != -128.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar4 = 0x19d;
  }
  else {
    uVar7 = (ulong)(uint)outfptr->Fptr->compress_type;
    if ((uVar7 < 0x34) && ((0x8000000600800U >> (uVar7 & 0x3f) & 1) != 0)) {
      *intlength = 1;
      if (nullcheck == 1) {
        if (0 < tilelen) {
          cVar2 = *nullflagval;
          lVar9 = tilelen + 1;
          do {
            cVar3 = *(char *)((long)tiledata + lVar9 + -2);
            cVar6 = cVar3 + -0x80;
            if (cVar3 == cVar2) {
              cVar6 = (char)nullval;
            }
            *(char *)((long)tiledata + lVar9 + -2) = cVar6;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
      }
      else if (0 < tilelen) {
        lVar9 = tilelen + 1;
        do {
          pbVar1 = (byte *)((long)tiledata + lVar9 + -2);
          *pbVar1 = *pbVar1 ^ 0x80;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        if (0 < tilelen) {
          cVar2 = *nullflagval;
          lVar9 = tilelen + 1;
          do {
            cVar3 = *(char *)((long)tiledata + lVar9 + -2);
            iVar4 = cVar3 + 0x80;
            if (cVar3 == cVar2) {
              iVar4 = nullval;
            }
            *(int *)((long)tiledata + lVar9 * 4 + -8) = iVar4;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
      }
      else if (*status < 1) {
        lVar9 = 10000;
        if (tilelen < 10000) {
          lVar9 = tilelen;
        }
        __src = malloc(lVar9 * 4);
        if (__src == (void *)0x0) {
          ffpmsg("Out of memory. (fits_sbyte_to_int_inplace)");
          *status = 0x71;
        }
        else {
          if (0 < tilelen) {
            lVar10 = tilelen - lVar9;
            do {
              lVar5 = 1;
              if (1 < lVar9) {
                lVar5 = lVar9;
              }
              lVar8 = 0;
              do {
                *(int *)((long)__src + lVar8 * 4) =
                     *(char *)((long)tiledata + lVar8 + lVar10) + 0x80;
                lVar8 = lVar8 + 1;
              } while (lVar5 != lVar8);
              memcpy((void *)((long)tiledata + lVar10 * 4),__src,lVar9 * 4);
              if (lVar10 < 0x2711) {
                lVar9 = lVar10;
              }
              lVar5 = lVar10 + -10000;
              if (lVar10 < 0x2711) {
                lVar5 = 0;
              }
              if (lVar10 == 0) {
                lVar9 = lVar10;
              }
              lVar10 = lVar5;
            } while (0 < lVar9);
          }
          free(__src);
        }
      }
    }
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int imcomp_convert_tile_tsbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    signed char *sbbuff;

       /* datatype of input array is signed byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = -128.  */

       if (zbitpix != BYTE_IMG|| scale != 1.0 || zero != -128.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       }

       idata = (int *) tiledata;
       sbbuff = (signed char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               /* offset the other pixel values (by flipping the MSB) */

               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       sbbuff[ii] = (signed char) nullval;
                    else
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;               }
           } else {  /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--) 
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;
           }

       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = ((int) sbbuff[ii]) + 128;
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbbuff to an I*4 array, in place */
                 /* sbbuff must have been allocated large enough to do this */
                 fits_sbyte_to_int_inplace(sbbuff, tilelen, status);
           }
       }
 
       return(*status);
}